

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers_unittest.cc
# Opt level: O2

void Test_TemplateModifiers_FindModifier::Run(void)

{
  char cVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  NullModifier foo_modifier4;
  NullModifier foo_modifier3;
  NullModifier foo_modifier2;
  NullModifier foo_modifier5;
  NullModifier foo_modifier1;
  
  lVar2 = ctemplate::FindModifier("html_escape",0xb,"",0);
  if (lVar2 == 0) {
    pcVar3 = "(info = ctemplate::FindModifier(\"html_escape\", 11, \"\", 0))";
  }
  else {
    if (*(undefined8 **)(lVar2 + 0x28) != &ctemplate::html_escape) {
LAB_001102bb:
      pcVar3 = "info->modifier";
      pcVar4 = "&ctemplate::html_escape";
LAB_001107b1:
      fprintf(_stderr,"Check failed: %s %s %s\n",pcVar3,"==",pcVar4);
      goto LAB_001107b8;
    }
    lVar2 = ctemplate::FindModifier("h",1,"",0);
    if (lVar2 == 0) {
      pcVar3 = "(info = ctemplate::FindModifier(\"h\", 1, \"\", 0))";
    }
    else {
      if (*(undefined8 **)(lVar2 + 0x28) != &ctemplate::html_escape) goto LAB_001102bb;
      lVar2 = ctemplate::FindModifier("html_escape_with_arg",0x14,"=pre",4);
      if (lVar2 == 0) {
        pcVar3 = "(info = ctemplate::FindModifier(\"html_escape_with_arg\", 20, \"=pre\", 4))";
      }
      else {
        if (*(undefined8 **)(lVar2 + 0x28) != &ctemplate::pre_escape) {
LAB_001102e6:
          pcVar3 = "info->modifier";
          pcVar4 = "&ctemplate::pre_escape";
          goto LAB_001107b1;
        }
        lVar2 = ctemplate::FindModifier("H",1,"=pre",4);
        if (lVar2 == 0) {
          pcVar3 = "(info = ctemplate::FindModifier(\"H\", 1, \"=pre\", 4))";
        }
        else {
          if (*(undefined8 **)(lVar2 + 0x28) != &ctemplate::pre_escape) goto LAB_001102e6;
          lVar2 = ctemplate::FindModifier("javascript_escape_with_arg",0x1a,"=number",7);
          if (lVar2 == 0) {
            pcVar3 = 
            "(info = ctemplate::FindModifier(\"javascript_escape_with_arg\", 26, \"=number\", 7))";
          }
          else {
            lVar2 = ctemplate::FindModifier("J",1,"=number",7);
            if (lVar2 == 0) {
              pcVar3 = "(info = ctemplate::FindModifier(\"J\", 1, \"=number\", 7))";
            }
            else {
              if (*(undefined8 **)(lVar2 + 0x28) != &ctemplate::javascript_number) {
                pcVar3 = "info->modifier";
                pcVar4 = "&ctemplate::javascript_number";
                goto LAB_001107b1;
              }
              lVar2 = ctemplate::FindModifier("H",1,"=pre",2);
              if (lVar2 == 0) {
                lVar2 = ctemplate::FindModifier("H",1,"=pree",5);
                if (lVar2 == 0) {
                  lVar2 = ctemplate::FindModifier("H",1,"=notpresent",0xb);
                  if (lVar2 == 0) {
                    lVar2 = ctemplate::FindModifier("html_escape",0xb,"=p",2);
                    if (lVar2 == 0) {
                      lVar2 = ctemplate::FindModifier("h",1,"=p",2);
                      if (lVar2 == 0) {
                        lVar2 = ctemplate::FindModifier("html_escape_with_arg",0x14,"",0);
                        if (lVar2 == 0) {
                          lVar2 = ctemplate::FindModifier("H",1,"",0);
                          if (lVar2 == 0) {
                            _foo_modifier1 = ctemplate::GetDefaultModifierForXml;
                            _foo_modifier2 = ctemplate::GetDefaultModifierForXml;
                            _foo_modifier3 = ctemplate::GetDefaultModifierForXml;
                            _foo_modifier4 = ctemplate::GetDefaultModifierForXml;
                            cVar1 = ctemplate::AddModifier
                                              ("x-test",(TemplateModifier *)&foo_modifier1);
                            if (cVar1 == '\0') {
                              pcVar3 = "ctemplate::AddModifier(\"x-test\", &foo_modifier1)";
                            }
                            else {
                              cVar1 = ctemplate::AddModifier
                                                ("x-test-arg=",(TemplateModifier *)&foo_modifier2);
                              if (cVar1 == '\0') {
                                pcVar3 = "ctemplate::AddModifier(\"x-test-arg=\", &foo_modifier2)";
                              }
                              else {
                                cVar1 = ctemplate::AddModifier
                                                  ("x-test-arg=h",(TemplateModifier *)&foo_modifier3
                                                  );
                                if (cVar1 == '\0') {
                                  pcVar3 = 
                                  "ctemplate::AddModifier(\"x-test-arg=h\", &foo_modifier3)";
                                }
                                else {
                                  cVar1 = ctemplate::AddModifier
                                                    ("x-test-arg=json",
                                                     (TemplateModifier *)&foo_modifier4);
                                  if (cVar1 == '\0') {
                                    pcVar3 = 
                                    "ctemplate::AddModifier(\"x-test-arg=json\", &foo_modifier4)";
                                  }
                                  else {
                                    lVar2 = ctemplate::FindModifier("x-test",6,"",0);
                                    if (lVar2 != 0) {
                                      if (*(char *)(lVar2 + 0x22) == '\0') goto LAB_00110256;
                                      if (*(TemplateModifier **)(lVar2 + 0x28) ==
                                          (TemplateModifier *)&foo_modifier1) {
                                        if (*(int *)(lVar2 + 0x24) == 2) {
                                          lVar2 = ctemplate::FindModifier("x-test",6,"=h",2);
                                          if (lVar2 == 0) {
                                            pcVar3 = 
                                            "(info = ctemplate::FindModifier(\"x-test\", 6, \"=h\", 2))"
                                            ;
                                          }
                                          else {
                                            if (*(char *)(lVar2 + 0x22) == '\x01')
                                            goto LAB_0011029e;
                                            lVar2 = ctemplate::FindModifier("x-test-arg",10,"=p",2);
                                            if (lVar2 == 0) {
                                              pcVar3 = 
                                              "(info = ctemplate::FindModifier(\"x-test-arg\", 10, \"=p\", 2))"
                                              ;
                                            }
                                            else if (*(char *)(lVar2 + 0x22) == '\0') {
LAB_00110256:
                                              pcVar3 = "info->is_registered";
                                            }
                                            else {
                                              if (*(TemplateModifier **)(lVar2 + 0x28) !=
                                                  (TemplateModifier *)&foo_modifier2)
                                              goto LAB_00110273;
                                              lVar2 = ctemplate::FindModifier
                                                                ("x-test-arg",10,"=h",2);
                                              if (lVar2 == 0) {
                                                pcVar3 = 
                                                "(info = ctemplate::FindModifier(\"x-test-arg\", 10, \"=h\", 2))"
                                                ;
                                              }
                                              else {
                                                if (*(char *)(lVar2 + 0x22) == '\0')
                                                goto LAB_00110256;
                                                if (*(TemplateModifier **)(lVar2 + 0x28) !=
                                                    (TemplateModifier *)&foo_modifier3) {
                                                  pcVar3 = "info->modifier";
                                                  pcVar4 = "&foo_modifier3";
                                                  goto LAB_001107b1;
                                                }
                                                lVar2 = ctemplate::FindModifier
                                                                  ("x-test-arg",10,"=html",5);
                                                if (lVar2 == 0) {
                                                  pcVar3 = 
                                                  "(info = ctemplate::FindModifier(\"x-test-arg\", 10, \"=html\", 5))"
                                                  ;
                                                  goto LAB_0011075a;
                                                }
                                                if (*(char *)(lVar2 + 0x22) == '\0')
                                                goto LAB_00110256;
                                                if (*(TemplateModifier **)(lVar2 + 0x28) !=
                                                    (TemplateModifier *)&foo_modifier2)
                                                goto LAB_00110273;
                                                lVar2 = ctemplate::FindModifier
                                                                  ("x-test-arg",10,"=json",5);
                                                if (lVar2 == 0) {
                                                  pcVar3 = 
                                                  "(info = ctemplate::FindModifier(\"x-test-arg\", 10, \"=json\", 5))"
                                                  ;
                                                  goto LAB_0011075a;
                                                }
                                                if (*(char *)(lVar2 + 0x22) == '\0')
                                                goto LAB_00110256;
                                                if (*(TemplateModifier **)(lVar2 + 0x28) !=
                                                    (TemplateModifier *)&foo_modifier4) {
LAB_00110311:
                                                  pcVar3 = "info->modifier";
                                                  pcVar4 = "&foo_modifier4";
                                                  goto LAB_001107b1;
                                                }
                                                lVar2 = ctemplate::FindModifier
                                                                  ("x-test-arg",10,"json",4);
                                                if (lVar2 == 0) {
                                                  pcVar3 = 
                                                  "(info = ctemplate::FindModifier(\"x-test-arg\", 10, \"json\", 4))"
                                                  ;
                                                  goto LAB_0011075a;
                                                }
                                                if (*(char *)(lVar2 + 0x22) == '\0')
                                                goto LAB_00110256;
                                                if (*(TemplateModifier **)(lVar2 + 0x28) !=
                                                    (TemplateModifier *)&foo_modifier2)
                                                goto LAB_00110273;
                                                lVar2 = ctemplate::FindModifier
                                                                  ("x-test-arg",10,"=jsonnabbe",5);
                                                if (lVar2 == 0) {
                                                  pcVar3 = 
                                                  "(info = ctemplate::FindModifier(\"x-test-arg\", 10, \"=jsonnabbe\", 5))"
                                                  ;
                                                  goto LAB_0011075a;
                                                }
                                                if (*(char *)(lVar2 + 0x22) == '\0')
                                                goto LAB_00110256;
                                                if (*(TemplateModifier **)(lVar2 + 0x28) !=
                                                    (TemplateModifier *)&foo_modifier4)
                                                goto LAB_00110311;
                                                lVar2 = ctemplate::FindModifier
                                                                  ("x-test-arg",10,"=jsonnabbe",6);
                                                if (lVar2 == 0) {
                                                  pcVar3 = 
                                                  "(info = ctemplate::FindModifier(\"x-test-arg\", 10, \"=jsonnabbe\", 6))"
                                                  ;
                                                  goto LAB_0011075a;
                                                }
                                                if (*(char *)(lVar2 + 0x22) == '\0')
                                                goto LAB_00110256;
                                                if (*(TemplateModifier **)(lVar2 + 0x28) !=
                                                    (TemplateModifier *)&foo_modifier2) {
LAB_00110273:
                                                  pcVar3 = "info->modifier";
                                                  pcVar4 = "&foo_modifier2";
                                                  goto LAB_001107b1;
                                                }
                                                lVar2 = ctemplate::FindModifier
                                                                  ("x-test-arg",10,"=jsonnabbe",4);
                                                if (lVar2 == 0) {
                                                  pcVar3 = 
                                                  "(info = ctemplate::FindModifier(\"x-test-arg\", 10, \"=jsonnabbe\", 4))"
                                                  ;
                                                  goto LAB_0011075a;
                                                }
                                                if (*(char *)(lVar2 + 0x22) == '\0')
                                                goto LAB_00110256;
                                                if (*(TemplateModifier **)(lVar2 + 0x28) !=
                                                    (TemplateModifier *)&foo_modifier2)
                                                goto LAB_00110273;
                                                lVar2 = ctemplate::FindModifier("x-foo",5,"",0);
                                                if (lVar2 == 0) {
                                                  pcVar3 = 
                                                  "(info = ctemplate::FindModifier(\"x-foo\", 5, \"\", 0))"
                                                  ;
                                                }
                                                else if (*(char *)(lVar2 + 0x22) == '\x01') {
LAB_0011029e:
                                                  pcVar3 = "!(info->is_registered)";
                                                }
                                                else {
                                                  lVar2 = ctemplate::FindModifier("x-bar",5,"=p",2);
                                                  if (lVar2 == 0) {
                                                    pcVar3 = 
                                                  "(info = ctemplate::FindModifier(\"x-bar\", 5, \"=p\", 2))"
                                                  ;
                                                  }
                                                  else {
                                                    if (*(char *)(lVar2 + 0x22) == '\x01')
                                                    goto LAB_0011029e;
                                                    _foo_modifier5 =
                                                         ctemplate::GetDefaultModifierForXml;
                                                    cVar1 = ctemplate::AddXssSafeModifier
                                                                      ("x-safetest",
                                                                       (TemplateModifier *)
                                                                       &foo_modifier5);
                                                    if (cVar1 == '\0') {
                                                      pcVar3 = 
                                                  "ctemplate::AddXssSafeModifier(\"x-safetest\", &foo_modifier5)"
                                                  ;
                                                  }
                                                  else {
                                                    lVar2 = ctemplate::FindModifier
                                                                      ("x-safetest",10,"",0);
                                                    if (lVar2 != 0) {
                                                      if (*(char *)(lVar2 + 0x22) != '\0') {
                                                        if (*(int *)(lVar2 + 0x24) == 3) {
                                                          if (*(TemplateModifier **)(lVar2 + 0x28)
                                                              == (TemplateModifier *)&foo_modifier5)
                                                          {
                                                            ctemplate::TemplateModifier::
                                                            ~TemplateModifier((TemplateModifier *)
                                                                              &foo_modifier5);
                                                            ctemplate::TemplateModifier::
                                                            ~TemplateModifier((TemplateModifier *)
                                                                              &foo_modifier4);
                                                            ctemplate::TemplateModifier::
                                                            ~TemplateModifier((TemplateModifier *)
                                                                              &foo_modifier3);
                                                            ctemplate::TemplateModifier::
                                                            ~TemplateModifier((TemplateModifier *)
                                                                              &foo_modifier2);
                                                            ctemplate::TemplateModifier::
                                                            ~TemplateModifier((TemplateModifier *)
                                                                              &foo_modifier1);
                                                            return;
                                                          }
                                                          pcVar3 = "info->modifier";
                                                          pcVar4 = "&foo_modifier5";
                                                        }
                                                        else {
                                                          pcVar3 = "info->xss_class";
                                                          pcVar4 = "ctemplate::XSS_SAFE";
                                                        }
                                                        goto LAB_001107b1;
                                                      }
                                                      goto LAB_00110256;
                                                    }
                                                    pcVar3 = 
                                                  "(info = ctemplate::FindModifier(\"x-safetest\", 10, \"\", 0))"
                                                  ;
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                          goto LAB_0011075a;
                                        }
                                        pcVar3 = "info->xss_class";
                                        pcVar4 = "ctemplate::XSS_UNIQUE";
                                      }
                                      else {
                                        pcVar3 = "info->modifier";
                                        pcVar4 = "&foo_modifier1";
                                      }
                                      goto LAB_001107b1;
                                    }
                                    pcVar3 = 
                                    "(info = ctemplate::FindModifier(\"x-test\", 6, \"\", 0))";
                                  }
                                }
                              }
                            }
                          }
                          else {
                            pcVar3 = "!(ctemplate::FindModifier(\"H\", 1, \"\", 0))";
                          }
                        }
                        else {
                          pcVar3 = 
                          "!(ctemplate::FindModifier(\"html_escape_with_arg\", 20, \"\", 0))";
                        }
                      }
                      else {
                        pcVar3 = "!(ctemplate::FindModifier(\"h\", 1, \"=p\", 2))";
                      }
                    }
                    else {
                      pcVar3 = "!(ctemplate::FindModifier(\"html_escape\", 11, \"=p\", 2))";
                    }
                  }
                  else {
                    pcVar3 = "!(ctemplate::FindModifier(\"H\", 1, \"=notpresent\", 11))";
                  }
                }
                else {
                  pcVar3 = "!(ctemplate::FindModifier(\"H\", 1, \"=pree\", 5))";
                }
              }
              else {
                pcVar3 = "!(ctemplate::FindModifier(\"H\", 1, \"=pre\", 2))";
              }
            }
          }
        }
      }
    }
  }
LAB_0011075a:
  fprintf(_stderr,"Check failed: %s\n",pcVar3);
LAB_001107b8:
  exit(1);
}

Assistant:

TEST(TemplateModifiers, FindModifier) {
  const GOOGLE_NAMESPACE::ModifierInfo* info;
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("html_escape", 11, "", 0)));
  EXPECT_EQ(info->modifier, &GOOGLE_NAMESPACE::html_escape);
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("h", 1, "", 0)));
  EXPECT_EQ(info->modifier, &GOOGLE_NAMESPACE::html_escape);

  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("html_escape_with_arg", 20,
                                              "=pre", 4)));
  EXPECT_EQ(info->modifier, &GOOGLE_NAMESPACE::pre_escape);
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("H", 1, "=pre", 4)));
  EXPECT_EQ(info->modifier, &GOOGLE_NAMESPACE::pre_escape);

  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("javascript_escape_with_arg",
                                              26, "=number", 7)));
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("J", 1, "=number", 7)));
  EXPECT_EQ(info->modifier, &GOOGLE_NAMESPACE::javascript_number);

  // html_escape_with_arg doesn't have a default value, so these should fail.
  EXPECT_FALSE(GOOGLE_NAMESPACE::FindModifier("H", 1, "=pre", 2));  // "=p"
  EXPECT_FALSE(GOOGLE_NAMESPACE::FindModifier("H", 1, "=pree", 5));
  EXPECT_FALSE(GOOGLE_NAMESPACE::FindModifier("H", 1, "=notpresent", 11));

  // If we don't have a modifier-value when we ought, we should fail.
  EXPECT_FALSE(GOOGLE_NAMESPACE::FindModifier("html_escape", 11, "=p", 2));
  EXPECT_FALSE(GOOGLE_NAMESPACE::FindModifier("h", 1, "=p", 2));

  EXPECT_FALSE(GOOGLE_NAMESPACE::FindModifier("html_escape_with_arg", 20,
                                       "", 0));
  EXPECT_FALSE(GOOGLE_NAMESPACE::FindModifier("H", 1, "", 0));

  // Test with added modifiers as well.
  GOOGLE_NAMESPACE::NullModifier foo_modifier1;
  GOOGLE_NAMESPACE::NullModifier foo_modifier2;
  GOOGLE_NAMESPACE::NullModifier foo_modifier3;
  GOOGLE_NAMESPACE::NullModifier foo_modifier4;
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-test", &foo_modifier1));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-test-arg=", &foo_modifier2));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-test-arg=h", &foo_modifier3));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-test-arg=json", &foo_modifier4));

  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-test", 6, "", 0)));
  EXPECT_TRUE(info->is_registered);
  EXPECT_EQ(info->modifier, &foo_modifier1);
  EXPECT_EQ(info->xss_class, GOOGLE_NAMESPACE::XSS_UNIQUE);
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-test", 6, "=h", 2)));
  EXPECT_FALSE(info->is_registered);
  // This tests default values
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-test-arg", 10, "=p", 2)));
  EXPECT_TRUE(info->is_registered);
  EXPECT_EQ(info->modifier, &foo_modifier2);
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-test-arg", 10, "=h", 2)));
  EXPECT_TRUE(info->is_registered);
  EXPECT_EQ(info->modifier, &foo_modifier3);
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-test-arg", 10, "=html", 5)));
  EXPECT_TRUE(info->is_registered);
  EXPECT_EQ(info->modifier, &foo_modifier2);
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-test-arg", 10, "=json", 5)));
  EXPECT_TRUE(info->is_registered);
  EXPECT_EQ(info->modifier, &foo_modifier4);
  // The value is required to start with an '=' to match the
  // specialization.  If it doesn't, it will match the default.
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-test-arg", 10, "json", 4)));
  EXPECT_TRUE(info->is_registered);
  EXPECT_EQ(info->modifier, &foo_modifier2);
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-test-arg", 10,
                                              "=jsonnabbe", 5)));
  EXPECT_TRUE(info->is_registered);
  EXPECT_EQ(info->modifier, &foo_modifier4);
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-test-arg", 10,
                                              "=jsonnabbe", 6)));
  EXPECT_TRUE(info->is_registered);
  EXPECT_EQ(info->modifier, &foo_modifier2);
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-test-arg", 10,
                                              "=jsonnabbe", 4)));
  EXPECT_TRUE(info->is_registered);
  EXPECT_EQ(info->modifier, &foo_modifier2);

  // If we try to find an x- modifier that wasn't added, we should get
  // a legit but "unknown" modifier back.
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-foo", 5, "", 0)));
  EXPECT_FALSE(info->is_registered);
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-bar", 5, "=p", 2)));
  EXPECT_FALSE(info->is_registered);

  // Basic test with added XssSafe modifier.
  GOOGLE_NAMESPACE::NullModifier foo_modifier5;
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddXssSafeModifier("x-safetest",
                                            &foo_modifier5));
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-safetest", 10, "", 0)));
  EXPECT_TRUE(info->is_registered);
  EXPECT_EQ(info->xss_class, GOOGLE_NAMESPACE::XSS_SAFE);
  EXPECT_EQ(info->modifier, &foo_modifier5);
}